

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O2

void fetch_feed_db(feed_db_t *db,feed_t *feed)

{
  int iVar1;
  
  iVar1 = fetch_all_agencies_db(db,&feed->agencies);
  feed->agency_count = iVar1;
  iVar1 = fetch_all_calendar_dates_db(db,&feed->calendar_dates);
  feed->calendar_dates_count = iVar1;
  iVar1 = fetch_all_calendar_records_db(db,&feed->calendar_records);
  feed->calendar_records_count = iVar1;
  iVar1 = fetch_all_fare_attributes_db(db,&feed->fare_attributes);
  feed->fare_attributes_count = iVar1;
  iVar1 = fetch_all_fare_rules_db(db,&feed->fare_rules);
  feed->fare_rules_count = iVar1;
  iVar1 = fetch_all_feed_info_db(db,&feed->feed_info);
  feed->feed_info_count = iVar1;
  iVar1 = fetch_all_frequencies_db(db,&feed->frequencies);
  feed->frequencies_count = iVar1;
  iVar1 = fetch_all_levels_db(db,&feed->levels);
  feed->levels_count = iVar1;
  iVar1 = fetch_all_pathways_db(db,&feed->pathways);
  feed->pathways_count = iVar1;
  iVar1 = fetch_all_routes_db(db,&feed->routes);
  feed->routes_count = iVar1;
  iVar1 = fetch_all_shapes_db(db,&feed->shapes);
  feed->shapes_count = iVar1;
  iVar1 = fetch_all_stop_times_db(db,&feed->stop_times);
  feed->stop_times_count = iVar1;
  iVar1 = fetch_all_stops_db(db,&feed->stops);
  feed->stops_count = iVar1;
  iVar1 = fetch_all_transfers_db(db,&feed->transfers);
  feed->transfers_count = iVar1;
  iVar1 = fetch_all_trips_db(db,&feed->trips);
  feed->trips_count = iVar1;
  return;
}

Assistant:

void fetch_feed_db(feed_db_t *db, feed_t *feed) {
    feed->agency_count = fetch_all_agencies_db(db, &(feed->agencies));
    feed->calendar_dates_count = fetch_all_calendar_dates_db(db, &(feed->calendar_dates));
    feed->calendar_records_count = fetch_all_calendar_records_db(db, &(feed->calendar_records));
    feed->fare_attributes_count = fetch_all_fare_attributes_db(db, &(feed->fare_attributes));
    feed->fare_rules_count = fetch_all_fare_rules_db(db, &(feed->fare_rules));
    feed->feed_info_count = fetch_all_feed_info_db(db, &(feed->feed_info));
    feed->frequencies_count = fetch_all_frequencies_db(db, &(feed->frequencies));
    feed->levels_count = fetch_all_levels_db(db, &(feed->levels));
    feed->pathways_count = fetch_all_pathways_db(db, &(feed->pathways));
    feed->routes_count = fetch_all_routes_db(db, &(feed->routes));
    feed->shapes_count = fetch_all_shapes_db(db, &(feed->shapes));
    feed->stop_times_count = fetch_all_stop_times_db(db, &(feed->stop_times));
    feed->stops_count = fetch_all_stops_db(db, &(feed->stops));
    feed->transfers_count = fetch_all_transfers_db(db, &(feed->transfers));
    feed->trips_count = fetch_all_trips_db(db, &(feed->trips));
}